

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_gen_prime
              (mbedtls_mpi *X,size_t nbits,int dh_flag,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
              void *p_rng)

{
  ulong uVar1;
  void *p_rng_00;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_00;
  int iVar2;
  ulong *puVar3;
  size_t sVar4;
  long lVar5;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi _B;
  mbedtls_mpi Y;
  mbedtls_mpi_uint r;
  mbedtls_mpi_uint local_90;
  void *local_88;
  _func_int_void_ptr_uchar_ptr_size_t *local_80;
  int local_74;
  mbedtls_mpi local_70;
  mbedtls_mpi local_58;
  size_t local_40;
  mbedtls_mpi_uint local_38;
  
  if (nbits - 0x2001 < 0xffffffffffffe002) {
    return -4;
  }
  local_58.s = 1;
  local_58.n = 0;
  local_58.p = (mbedtls_mpi_uint *)0x0;
  lVar5 = ((nbits >> 6) + 1) - (ulong)((nbits & 0x3f) == 0);
  local_80 = f_rng;
  local_74 = dh_flag;
  iVar2 = mbedtls_mpi_fill_random(X,lVar5 * 8,f_rng,p_rng);
  if (iVar2 == 0) {
    local_40 = lVar5 * 0x40 - nbits;
    local_88 = p_rng;
    do {
      puVar3 = X->p;
      if (0xb504f333f9de6484 < puVar3[lVar5 + -1]) {
        if (nbits < (ulong)(lVar5 * 0x40)) {
          iVar2 = mbedtls_mpi_shift_r(X,local_40);
          if (iVar2 != 0) break;
          puVar3 = X->p;
        }
        uVar1 = *puVar3;
        *puVar3 = uVar1 | 1;
        if (local_74 != 0) {
          *puVar3 = uVar1 | 3;
          iVar2 = mbedtls_mpi_mod_int(&local_38,X,3);
          if (iVar2 != 0) break;
          if (local_38 == 1) {
            local_90 = 4;
LAB_00124adc:
            local_70.p = &local_90;
            local_70.s = 1;
            local_70.n = 1;
            iVar2 = mbedtls_mpi_add_mpi(X,X,&local_70);
            if (iVar2 != 0) break;
          }
          else if (local_38 == 0) {
            local_90 = 8;
            goto LAB_00124adc;
          }
          iVar2 = mbedtls_mpi_copy(&local_58,X);
          if ((iVar2 == 0) &&
             (iVar2 = mbedtls_mpi_shift_r(&local_58,1), p_rng_00 = local_88, iVar2 == 0)) {
            goto LAB_00124b46;
          }
          break;
        }
        iVar2 = mbedtls_mpi_is_prime(X,local_80,local_88);
        if (iVar2 != -0xe) break;
      }
      iVar2 = mbedtls_mpi_fill_random(X,lVar5 * 8,local_80,local_88);
    } while (iVar2 == 0);
  }
  goto LAB_00124a76;
  while( true ) {
    local_90 = 0xc;
    local_70.s = 1;
    local_70.n = 1;
    local_70.p = &local_90;
    iVar2 = mbedtls_mpi_add_mpi(X,X,&local_70);
    if (iVar2 != 0) break;
    local_90 = 6;
    local_70.s = 1;
    local_70.n = 1;
    local_70.p = &local_90;
    iVar2 = mbedtls_mpi_add_mpi(&local_58,&local_58,&local_70);
    if (iVar2 != 0) break;
LAB_00124b46:
    iVar2 = mpi_check_small_factors(X);
    if (((iVar2 == 0) &&
        (iVar2 = mpi_check_small_factors(&local_58), f_rng_00 = local_80, iVar2 == 0)) &&
       (iVar2 = mpi_miller_rabin(X,local_80,p_rng_00), iVar2 == 0)) {
      iVar2 = mpi_miller_rabin(&local_58,f_rng_00,p_rng_00);
    }
    if (iVar2 != -0xe) break;
  }
LAB_00124a76:
  if (local_58.p != (mbedtls_mpi_uint *)0x0) {
    if (local_58.n != 0) {
      sVar4 = 0;
      do {
        local_58.p[sVar4] = 0;
        sVar4 = sVar4 + 1;
      } while (local_58.n != sVar4);
    }
    free(local_58.p);
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_gen_prime( mbedtls_mpi *X, size_t nbits, int dh_flag,
                   int (*f_rng)(void *, unsigned char *, size_t),
                   void *p_rng )
{
#ifdef MBEDTLS_HAVE_INT64
// ceil(2^63.5)
#define CEIL_MAXUINT_DIV_SQRT2 0xb504f333f9de6485ULL
#else
// ceil(2^31.5)
#define CEIL_MAXUINT_DIV_SQRT2 0xb504f334U
#endif
    int ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
    size_t k, n;
    mbedtls_mpi_uint r;
    mbedtls_mpi Y;

    if( nbits < 3 || nbits > MBEDTLS_MPI_MAX_BITS )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    mbedtls_mpi_init( &Y );

    n = BITS_TO_LIMBS( nbits );

    while( 1 )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( X, n * ciL, f_rng, p_rng ) );
        /* make sure generated number is at least (nbits-1)+0.5 bits (FIPS 186-4 §B.3.3 steps 4.4, 5.5) */
        if( X->p[n-1] < CEIL_MAXUINT_DIV_SQRT2 ) continue;

        k = n * biL;
        if( k > nbits ) MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( X, k - nbits ) );
        X->p[0] |= 1;

        if( dh_flag == 0 )
        {
            ret = mbedtls_mpi_is_prime( X, f_rng, p_rng );

            if( ret != MBEDTLS_ERR_MPI_NOT_ACCEPTABLE )
                goto cleanup;
        }
        else
        {
            /*
             * An necessary condition for Y and X = 2Y + 1 to be prime
             * is X = 2 mod 3 (which is equivalent to Y = 2 mod 3).
             * Make sure it is satisfied, while keeping X = 3 mod 4
             */

            X->p[0] |= 2;

            MBEDTLS_MPI_CHK( mbedtls_mpi_mod_int( &r, X, 3 ) );
            if( r == 0 )
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, X, 8 ) );
            else if( r == 1 )
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, X, 4 ) );

            /* Set Y = (X-1) / 2, which is X / 2 because X is odd */
            MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Y, X ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &Y, 1 ) );

            while( 1 )
            {
                /*
                 * First, check small factors for X and Y
                 * before doing Miller-Rabin on any of them
                 */
                if( ( ret = mpi_check_small_factors(  X         ) ) == 0 &&
                    ( ret = mpi_check_small_factors( &Y         ) ) == 0 &&
                    ( ret = mpi_miller_rabin(  X, f_rng, p_rng  ) ) == 0 &&
                    ( ret = mpi_miller_rabin( &Y, f_rng, p_rng  ) ) == 0 )
                    goto cleanup;

                if( ret != MBEDTLS_ERR_MPI_NOT_ACCEPTABLE )
                    goto cleanup;

                /*
                 * Next candidates. We want to preserve Y = (X-1) / 2 and
                 * Y = 1 mod 2 and Y = 2 mod 3 (eq X = 3 mod 4 and X = 2 mod 3)
                 * so up Y by 6 and X by 12.
                 */
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int(  X,  X, 12 ) );
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( &Y, &Y, 6  ) );
            }
        }
    }

cleanup:

    mbedtls_mpi_free( &Y );

    return( ret );
}